

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O1

int Vec_BitCount(Vec_Bit_t *p)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = p->nSize;
  uVar2 = (uint)((uVar3 & 0x1f) != 0) + ((int)uVar3 >> 5);
  piVar1 = p->pArray;
  if ((uVar3 & 0x1f) == 0) {
    if ((int)uVar2 < 1) {
      iVar5 = 0;
    }
    else {
      uVar4 = 0;
      iVar5 = 0;
      do {
        uVar3 = ((uint)piVar1[uVar4] >> 1 & 0x55555555) + (piVar1[uVar4] & 0x55555555U);
        uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
        uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
        uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
        iVar5 = (uVar3 >> 0x10) + iVar5 + (uVar3 & 0xffff);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  else {
    if ((int)uVar2 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x256,"int Vec_BitCount(Vec_Bit_t *)");
    }
    if (uVar2 == 1) {
      uVar7 = 0;
      iVar5 = 0;
    }
    else {
      uVar6 = 2;
      if (2 < (int)uVar2) {
        uVar6 = uVar2;
      }
      uVar7 = (ulong)(uVar6 - 1);
      uVar4 = 0;
      iVar5 = 0;
      do {
        uVar2 = ((uint)piVar1[uVar4] >> 1 & 0x55555555) + (piVar1[uVar4] & 0x55555555U);
        uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
        uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
        uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
        iVar5 = iVar5 + (uVar2 >> 0x10) + (uVar2 & 0xffff);
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
    }
    uVar3 = ~(-1 << (sbyte)(uVar3 & 0x1f)) & piVar1[uVar7];
    uVar3 = (uVar3 >> 1 & 0x15555555) + (uVar3 & 0x55555555);
    uVar3 = (uVar3 >> 2 & 0x13333333) + (uVar3 & 0x33333333);
    uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
    uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
    iVar5 = (uVar3 >> 0x10) + iVar5 + (uVar3 & 0xffff);
  }
  return iVar5;
}

Assistant:

static inline int Vec_BitCount( Vec_Bit_t * p ) 
{
    unsigned * pArray = (unsigned *)p->pArray;
    int nWords = (p->nSize >> 5) + ((p->nSize & 31) > 0);
    int i, Counter = 0;
    if ( p->nSize & 31 )
    {
        assert( nWords > 0 );
        for ( i = 0; i < nWords-1; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
        Counter += Vec_BitCountWord( pArray[i] & ~(~0 << (p->nSize & 31)) );
    }
    else
    {
        for ( i = 0; i < nWords; i++ )
            Counter += Vec_BitCountWord( pArray[i] );
    }
    return Counter;
}